

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O0

Pattern * slang::ast::VariablePattern::fromSyntax(VariablePatternSyntax *syntax,ASTContext *context)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  Compilation *args_1;
  PatternVarSymbol *args;
  VariablePattern *pVVar2;
  Symbol *this;
  SyntaxNode *pSVar3;
  long in_RSI;
  SyntaxNode *in_RDI;
  string_view sVar4;
  SourceRange SVar5;
  Symbol *var;
  TempVarSymbol *currVar;
  string_view name;
  Compilation *comp;
  Pattern *in_stack_ffffffffffffff48;
  Compilation *in_stack_ffffffffffffff50;
  Token *in_stack_ffffffffffffff60;
  PatternVarSymbol *in_stack_ffffffffffffff68;
  BumpAllocator *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff98 [16];
  SyntaxNode *pSVar6;
  Scope *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  int *local_38;
  Scope *local_30;
  char *local_28;
  VariablePattern *local_8;
  
  args_1 = ASTContext::getCompilation((ASTContext *)0x8fc704);
  sVar4 = parsing::Token::valueText(in_stack_ffffffffffffff60);
  local_38 = *(int **)(in_RSI + 0x20);
  while( true ) {
    pSVar6 = in_stack_ffffffffffffff98._8_8_;
    local_30 = (Scope *)sVar4._M_len;
    local_28 = sVar4._M_str;
    if (local_38 == (int *)0x0) {
      not_null<const_slang::ast::Scope_*>::operator->
                ((not_null<const_slang::ast::Scope_*> *)0x8fc830);
      sVar4._M_str = in_stack_ffffffffffffffb8;
      sVar4._M_len = (size_t)in_stack_ffffffffffffffb0;
      this = Scope::find(in_stack_ffffffffffffffa8,sVar4);
      if (((this == (Symbol *)0x0) || (this->kind != PatternVar)) ||
         (pSVar3 = Symbol::getSyntax(this), pSVar3 != in_RDI)) {
        local_8 = (VariablePattern *)
                  Pattern::badPattern(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      }
      else {
        Symbol::as<slang::ast::PatternVarSymbol>((Symbol *)0x8fc8b9);
        SVar5 = slang::syntax::SyntaxNode::sourceRange(pSVar6);
        local_8 = BumpAllocator::
                  emplace<slang::ast::VariablePattern,slang::ast::PatternVarSymbol_const&,slang::SourceRange>
                            ((BumpAllocator *)SVar5.startLoc,in_stack_ffffffffffffff68,
                             (SourceRange *)in_stack_ffffffffffffff60);
      }
      return &local_8->super_Pattern;
    }
    in_stack_ffffffffffffffb8 = *(char **)(local_38 + 2);
    __x._M_str = in_stack_ffffffffffffff80;
    __x._M_len = in_stack_ffffffffffffff78;
    __y._M_str = (char *)in_stack_ffffffffffffff70;
    __y._M_len = (size_t)in_stack_ffffffffffffff68;
    bVar1 = std::operator==(__x,__y);
    pSVar6 = in_stack_ffffffffffffff98._8_8_;
    if ((bVar1) && (*local_38 == 0x47)) break;
    local_38 = *(int **)(local_38 + 0x56);
    in_stack_ffffffffffffffa8 = local_30;
    in_stack_ffffffffffffffb0 = local_28;
  }
  args = Symbol::as<slang::ast::PatternVarSymbol>((Symbol *)0x8fc7ca);
  slang::syntax::SyntaxNode::sourceRange(pSVar6);
  pVVar2 = BumpAllocator::
           emplace<slang::ast::VariablePattern,slang::ast::PatternVarSymbol_const&,slang::SourceRange>
                     (in_stack_ffffffffffffff70,args,(SourceRange *)args_1);
  return &pVVar2->super_Pattern;
}

Assistant:

Pattern& VariablePattern::fromSyntax(const VariablePatternSyntax& syntax,
                                     const ASTContext& context) {
    // The pattern var has already been created in our scope, so just look it up.
    auto& comp = context.getCompilation();
    auto name = syntax.variableName.valueText();
    auto currVar = context.firstTempVar;
    while (currVar) {
        if (currVar->name == name && currVar->kind == SymbolKind::PatternVar) {
            return *comp.emplace<VariablePattern>(currVar->as<PatternVarSymbol>(),
                                                  syntax.sourceRange());
        }
        currVar = currVar->nextTemp;
    }

    auto var = context.scope->find(name);
    if (!var || var->kind != SymbolKind::PatternVar || var->getSyntax() != &syntax) {
        // Some other error has occurred, likely a duplicate name,
        // so just return an error.
        return badPattern(comp, nullptr);
    }

    return *comp.emplace<VariablePattern>(var->as<PatternVarSymbol>(), syntax.sourceRange());
}